

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::ShowAltLegend
               (char *title_id,ImPlotOrientation orientation,ImVec2 size,bool interactable)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  ImVec2 cr_min;
  ImVec2 p_max;
  ImVec2 cr_max;
  ImGuiContext *pIVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 IVar6;
  ImU32 col;
  ImPlotPlot *plot;
  ImGuiIO *pIVar7;
  float fVar8;
  float fVar9;
  ImRect bb_frame;
  ImVec2 local_70;
  ImRect legend_bb;
  ImVec2 local_58;
  
  pIVar4 = GImPlot;
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    this = pIVar2->DrawList;
    plot = GetPlot(title_id);
    local_70.x = 0.0;
    local_70.y = 0.0;
    if (plot == (ImPlotPlot *)0x0) {
      IVar1 = (pIVar4->Style).LegendPadding;
      fVar8 = IVar1.x;
      fVar9 = IVar1.y;
      fVar8 = fVar8 + fVar8;
      fVar9 = fVar9 + fVar9;
      local_58.x = 0.0;
      local_58.y = 0.0;
    }
    else {
      local_58 = CalcLegendSize(plot,&(pIVar4->Style).LegendInnerPadding,
                                &(pIVar4->Style).LegendSpacing,orientation);
      IVar1 = (pIVar4->Style).LegendPadding;
      fVar8 = IVar1.x;
      fVar9 = IVar1.y;
      fVar8 = fVar8 + fVar8 + local_58.x;
      fVar9 = fVar9 + fVar9 + local_58.y;
    }
    local_70 = local_58;
    IVar1 = ImGui::CalcItemSize(size,fVar8,fVar9);
    bb_frame.Min.x = (pIVar2->DC).CursorPos.x;
    bb_frame.Min.y = (pIVar2->DC).CursorPos.y;
    bb_frame.Max.x = IVar1.x + bb_frame.Min.x;
    bb_frame.Max.y = IVar1.y + bb_frame.Min.y;
    ImGui::ItemSize(&bb_frame,-1.0);
    bVar5 = ImGui::ItemAdd(&bb_frame,0,&bb_frame,0);
    if (bVar5) {
      IVar1.y = bb_frame.Min.y;
      IVar1.x = bb_frame.Min.x;
      p_max.y = bb_frame.Max.y;
      p_max.x = bb_frame.Max.x;
      IVar6 = GetStyleColorU32(5);
      ImGui::RenderFrame(IVar1,p_max,IVar6,true,(pIVar3->Style).FrameRounding);
      cr_min.y = bb_frame.Min.y;
      cr_min.x = bb_frame.Min.x;
      cr_max.y = bb_frame.Max.y;
      cr_max.x = bb_frame.Max.x;
      ImDrawList::PushClipRect(this,cr_min,cr_max,true);
      if (plot != (ImPlotPlot *)0x0) {
        bVar5 = false;
        IVar1 = GetLocationPos(&bb_frame,&local_70,0,&(pIVar4->Style).LegendPadding);
        legend_bb.Max.x = local_58.x + IVar1.x;
        legend_bb.Min = IVar1;
        legend_bb.Max.y = local_58.y + IVar1.y;
        if (interactable) {
          pIVar7 = ImGui::GetIO();
          bVar5 = ImRect::Contains(&bb_frame,&pIVar7->MousePos);
        }
        IVar6 = GetStyleColorU32(8);
        col = GetStyleColorU32(9);
        ImDrawList::AddRectFilled(this,&legend_bb.Min,&legend_bb.Max,IVar6,0.0,0);
        ImDrawList::AddRect(this,&legend_bb.Min,&legend_bb.Max,col,0.0,0,1.0);
        ShowLegendEntries(plot,&legend_bb,bVar5,&(pIVar4->Style).LegendInnerPadding,
                          &(pIVar4->Style).LegendSpacing,orientation,this);
      }
      ImDrawList::PopClipRect(this);
    }
  }
  return;
}

Assistant:

void ShowAltLegend(const char* title_id, ImPlotOrientation orientation, const ImVec2 size, bool interactable) {
    ImPlotContext& gp    = *GImPlot;
    ImGuiContext &G      = *GImGui;
    ImGuiWindow * Window = G.CurrentWindow;
    if (Window->SkipItems)
        return;
    ImDrawList &DrawList = *Window->DrawList;
    ImPlotPlot* plot = GetPlot(title_id);
    ImVec2 legend_size;
    ImVec2 default_size = gp.Style.LegendPadding * 2;
    if (plot != NULL) {
        legend_size  = CalcLegendSize(*plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation);
        default_size = legend_size + gp.Style.LegendPadding * 2;
    }
    ImVec2 frame_size = ImGui::CalcItemSize(size, default_size.x, default_size.y);
    ImRect bb_frame = ImRect(Window->DC.CursorPos, Window->DC.CursorPos + frame_size);
    ImGui::ItemSize(bb_frame);
    if (!ImGui::ItemAdd(bb_frame, 0, &bb_frame))
        return;
    ImGui::RenderFrame(bb_frame.Min, bb_frame.Max, GetStyleColorU32(ImPlotCol_FrameBg), true, G.Style.FrameRounding);
    DrawList.PushClipRect(bb_frame.Min, bb_frame.Max, true);
    if (plot != NULL) {
        const ImVec2 legend_pos  = GetLocationPos(bb_frame, legend_size, 0, gp.Style.LegendPadding);
        const ImRect legend_bb(legend_pos, legend_pos + legend_size);
        interactable = interactable && bb_frame.Contains(ImGui::GetIO().MousePos);
        // render legend box
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(legend_bb.Min, legend_bb.Max, col_bg);
        DrawList.AddRect(legend_bb.Min, legend_bb.Max, col_bd);
        // render entries
        ShowLegendEntries(*plot, legend_bb, interactable, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, orientation, DrawList);
    }
    DrawList.PopClipRect();
}